

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharsTrieBuilder::countElementUnits
          (UCharsTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex)

{
  UChar UVar1;
  UChar UVar2;
  bool bVar3;
  int local_24;
  int iStack_20;
  UChar unit;
  int32_t i;
  int32_t length;
  int32_t unitIndex_local;
  int32_t limit_local;
  int32_t start_local;
  UCharsTrieBuilder *this_local;
  
  iStack_20 = 0;
  local_24 = start;
  do {
    UVar1 = UCharsTrieElement::charAt(this->elements + local_24,unitIndex,&this->strings);
    do {
      local_24 = local_24 + 1;
      bVar3 = false;
      if (local_24 < limit) {
        UVar2 = UCharsTrieElement::charAt(this->elements + local_24,unitIndex,&this->strings);
        bVar3 = UVar1 == UVar2;
      }
    } while (bVar3);
    iStack_20 = iStack_20 + 1;
  } while (local_24 < limit);
  return iStack_20;
}

Assistant:

int32_t
UCharsTrieBuilder::countElementUnits(int32_t start, int32_t limit, int32_t unitIndex) const {
    int32_t length=0;  // Number of different units at unitIndex.
    int32_t i=start;
    do {
        UChar unit=elements[i++].charAt(unitIndex, strings);
        while(i<limit && unit==elements[i].charAt(unitIndex, strings)) {
            ++i;
        }
        ++length;
    } while(i<limit);
    return length;
}